

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_features.c
# Opt level: O2

void av1_set_speed_features_qindex_dependent(AV1_COMP *cpi,int speed)

{
  MODE MVar1;
  FRAME_UPDATE_TYPE FVar2;
  SEARCH_METHODS SVar3;
  byte bVar4;
  bool bVar5;
  uint auVar6 [2];
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  undefined4 uVar12;
  int iVar13;
  int aggr;
  
  iVar7 = frame_is_boosted(cpi);
  iVar10 = (cpi->common).width;
  iVar8 = (cpi->common).height;
  if (iVar10 < iVar8) {
    iVar8 = iVar10;
  }
  MVar1 = (cpi->oxcf).mode;
  if (MVar1 == '\x01') {
    if (speed < 6) {
      return;
    }
    lVar9 = 0x6096c;
    if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
      uVar11 = 0;
    }
    else {
      iVar10 = 0x96;
      if (0x2cf < iVar8) {
        iVar10 = 0x78;
      }
      iVar8 = 0xbe;
      if (iVar7 == 0) {
        iVar8 = iVar10;
      }
      uVar11 = (uint)(iVar8 < (cpi->common).quant_params.base_qindex);
    }
    goto LAB_0020aa04;
  }
  FVar2 = (cpi->ppi->gf_group).update_type[cpi->gf_frame_index];
  if (speed == 0) {
    if (iVar8 < 0x2d0) {
      iVar10 = 0x8c;
      if (FVar2 == '\x06') {
        iVar10 = 0x6e;
      }
      iVar13 = 0x46;
      if (iVar7 == 0) {
        iVar13 = iVar10;
      }
      if ((cpi->common).quant_params.base_qindex <= iVar13) {
        (cpi->sf).part_sf.simple_motion_search_split =
             2 - (uint)(cpi->common).features.allow_screen_content_tools;
        (cpi->sf).part_sf.simple_motion_search_early_term_none = 1;
        uVar12 = 0;
        lVar9 = 0x60c08;
LAB_0020a7a4:
        *(undefined4 *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar9) =
             uVar12;
      }
    }
    else {
      iVar10 = (cpi->common).quant_params.base_qindex;
      if (iVar10 < 0x81) {
        uVar11 = 0x437 < iVar8 | 2;
        (cpi->sf).rd_sf.perform_coeff_opt = uVar11;
        (cpi->winner_mode_params).coeff_opt_thresholds[2] = coeff_opt_thresholds[uVar11][2];
        auVar6 = coeff_opt_thresholds[uVar11][1];
        (cpi->winner_mode_params).coeff_opt_thresholds[0] = coeff_opt_thresholds[uVar11][0];
        (cpi->winner_mode_params).coeff_opt_thresholds[1] = auVar6;
        (cpi->sf).part_sf.simple_motion_search_split =
             2 - (uint)(cpi->common).features.allow_screen_content_tools;
        (cpi->sf).tx_sf.inter_tx_size_search_init_depth_sqr = 1;
        (cpi->sf).tx_sf.inter_tx_size_search_init_depth_rect = 1;
        (cpi->sf).tx_sf.intra_tx_size_search_init_depth_rect = 1;
        (cpi->sf).tx_sf.model_based_prune_tx_search_level = 0;
        if (iVar10 < 0x6d && 0x437 < iVar8) {
          uVar12 = 1;
          (cpi->sf).inter_sf.selective_ref_frame = 2;
          (cpi->sf).rd_sf.tx_domain_dist_level = (iVar7 == 0) + 1;
          (cpi->sf).rd_sf.tx_domain_dist_thres_level = 1;
          (cpi->sf).part_sf.simple_motion_search_early_term_none = 1;
          (cpi->sf).tx_sf.tx_type_search.ml_tx_split_thresh = 4000;
          (cpi->sf).interp_sf.cb_pred_filter_search = 0;
          (cpi->sf).tx_sf.tx_type_search.prune_2d_txfm_mode = '\x02';
          lVar9 = 0x60bf0;
          goto LAB_0020a7a4;
        }
      }
    }
LAB_0020a7fb:
    if (((cpi->oxcf).pass != AOM_RC_FIRST_PASS) && (cpi->compressor_stage != '\x01')) {
      bVar5 = 0x2cf < iVar8;
      iVar10 = (cpi->common).quant_params.base_qindex;
      if (ms_qindex_thresh[speed][bVar5][0] < iVar10) {
        SVar3 = "\x03"[bVar5];
        (cpi->sf).mv_sf.search_method = SVar3;
        (cpi->sf).tpl_sf.search_method = SVar3;
      }
      else if (ms_qindex_thresh[speed][bVar5][1] < iVar10) {
        (cpi->sf).mv_sf.search_method = '\x02';
      }
    }
LAB_0020a863:
    bVar5 = iVar7 != 0 || FVar2 == '\x06';
  }
  else {
    if (speed < 2) goto LAB_0020a7fb;
    iVar10 = 6;
    if ((uint)speed < 6) {
      iVar10 = speed;
    }
    if ((uint)speed < 4) {
      uVar11 = iVar10 - 2;
      if (uVar11 == 0 && iVar8 < 0x1e0) {
        iVar10 = 0x46;
      }
      else {
        iVar10 = *(int *)(&DAT_00463960 + (ulong)uVar11 * 4);
      }
      if ((cpi->common).features.allow_screen_content_tools == true) {
        iVar10 = *(int *)(&DAT_00463950 + (ulong)uVar11 * 4);
      }
      if (iVar7 == 0 && (cpi->common).quant_params.base_qindex <= iVar10) {
        (cpi->sf).part_sf.ext_partition_eval_thresh = BLOCK_128X128;
      }
      if (speed == 2) goto LAB_0020a7fb;
      goto LAB_0020a863;
    }
    if (speed == 4) {
      iVar10 = 0x78;
      iVar13 = 0x50;
LAB_0020aa77:
      if (iVar7 == 0) {
        iVar13 = iVar10;
      }
      if (((cpi->common).quant_params.base_qindex <= iVar13) &&
         (((cpi->common).current_frame.frame_type & 0xfd) != 0)) goto LAB_0020aa8f;
    }
    else {
      if (((uint)speed < 6 && 0x1df < iVar8) &&
         (((0x2cf < iVar8 || (((cpi->common).current_frame.frame_type & 0xfd) == 0)) ||
          ((cpi->common).features.allow_screen_content_tools == true)))) {
        iVar10 = 0xa0;
        iVar13 = 100;
        goto LAB_0020aa77;
      }
LAB_0020aa8f:
      (cpi->sf).part_sf.ext_partition_eval_thresh = BLOCK_128X128;
    }
    iVar10 = 5;
    if ((uint)speed < 5) {
      iVar10 = speed;
    }
    if (((0x1df < iVar8) &&
        ((cpi->common).quant_params.base_qindex <= *(int *)(&DAT_00463cf0 + (ulong)(iVar10 - 4) * 4)
        )) && (iVar7 == 0)) {
      (cpi->sf).part_sf.rect_partition_eval_thresh = 3;
    }
    bVar5 = iVar7 != 0 || FVar2 == '\x06';
    if (iVar7 == 0 && FVar2 != '\x06') {
      iVar10 = (cpi->common).quant_params.base_qindex;
      if ((iVar10 <= *(int *)(&DAT_00463cf8 + (ulong)(0x2cf < iVar8) * 4)) ||
         (*(int *)(&DAT_00463d00 + (ulong)(0x2cf < iVar8) * 4) < iVar10)) {
        (cpi->sf).lpf_sf.disable_loop_restoration_luma = 1;
      }
    }
  }
  if (speed == 5) {
    if (((((cpi->common).current_frame.frame_type & 0xfd) != 0) &&
        ((cpi->common).features.allow_screen_content_tools == false)) &&
       ((cpi->common).quant_params.base_qindex <
        *(int *)(&DAT_00463d08 + (ulong)(0x1df < iVar8) * 4))) {
      (cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning = 3;
    }
LAB_0020a8e5:
    if ((((cpi->common).features.allow_screen_content_tools == true) && (iVar8 < 0x1e1)) &&
       ((cpi->common).quant_params.base_qindex < 0x80)) {
      uVar12 = 0;
      lVar9 = 0x609cc;
LAB_0020a906:
      *(undefined4 *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar9) = uVar12;
    }
LAB_0020a909:
    (cpi->sf).lpf_sf.min_lr_unit_size = 0x40;
    (cpi->sf).lpf_sf.max_lr_unit_size = 0x100;
LAB_0020a921:
    if (0x2cf < iVar8) {
      (cpi->sf).lpf_sf.min_lr_unit_size = (uint)(0x59f < iVar8) * 0x80 + 0x80;
    }
    if (2 < (uint)speed || MVar1 == '\x02') {
      iVar10 = 0x100;
      if (iVar8 < 0x5a0) {
        iVar10 = (uint)(0x60 < (cpi->common).quant_params.base_qindex) * 0x80 + 0x80;
      }
      (cpi->sf).lpf_sf.min_lr_unit_size = iVar10;
      (cpi->sf).lpf_sf.max_lr_unit_size = iVar10;
    }
  }
  else {
    if (speed == 1) {
      if (!(bool)(200 < (cpi->common).quant_params.base_qindex | bVar5)) {
        uVar12 = 1;
        lVar9 = 0x60b24;
        goto LAB_0020a906;
      }
      goto LAB_0020a909;
    }
    if (4 < speed) goto LAB_0020a8e5;
    (cpi->sf).lpf_sf.min_lr_unit_size = 0x40;
    (cpi->sf).lpf_sf.max_lr_unit_size = 0x100;
    if (0 < speed) goto LAB_0020a921;
  }
  set_subpel_search_method
            (&cpi->mv_search_params,(cpi->oxcf).unit_test_cfg.motion_vector_unit_test,
             (cpi->sf).mv_sf.subpel_search_method);
  if (speed - 4U < 0xfffffffd) {
    return;
  }
  if ((cpi->oxcf).enable_low_complexity_decode == 0) {
    return;
  }
  iVar10 = (cpi->common).width;
  iVar8 = (cpi->common).height;
  if (iVar10 < iVar8) {
    iVar8 = iVar10;
  }
  if (0xee < iVar8 - 0x1e1U) {
    bVar4 = (cpi->ppi->gf_group).update_type[cpi->gf_frame_index];
    if (2 < (uint)speed) {
      return;
    }
    if (iVar8 < 0x2d0) {
      return;
    }
    if (5 < bVar4) {
      return;
    }
    if ((0x32U >> (bVar4 & 0x1f) & 1) == 0) {
      return;
    }
  }
  (cpi->sf).lpf_sf.min_lr_unit_size = 0x80;
  uVar11 = 0x80;
  lVar9 = 0x60c7c;
LAB_0020aa04:
  *(uint *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar9) = uVar11;
  return;
}

Assistant:

void av1_set_speed_features_qindex_dependent(AV1_COMP *cpi, int speed) {
  AV1_COMMON *const cm = &cpi->common;
  SPEED_FEATURES *const sf = &cpi->sf;
  WinnerModeParams *const winner_mode_params = &cpi->winner_mode_params;
  const int boosted = frame_is_boosted(cpi);
  const int is_480p_or_lesser = AOMMIN(cm->width, cm->height) <= 480;
  const int is_480p_or_larger = AOMMIN(cm->width, cm->height) >= 480;
  const int is_720p_or_larger = AOMMIN(cm->width, cm->height) >= 720;
  const int is_1080p_or_larger = AOMMIN(cm->width, cm->height) >= 1080;
  const int is_1440p_or_larger = AOMMIN(cm->width, cm->height) >= 1440;
  const int is_arf2_bwd_type =
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index] == INTNL_ARF_UPDATE;

  if (cpi->oxcf.mode == REALTIME) {
    if (speed >= 6) {
      const int qindex_thresh = boosted ? 190 : (is_720p_or_larger ? 120 : 150);
      sf->part_sf.adjust_var_based_rd_partitioning =
          frame_is_intra_only(cm)
              ? 0
              : cm->quant_params.base_qindex > qindex_thresh;
    }
    return;
  }

  if (speed == 0) {
    // qindex_thresh for resolution < 720p
    const int qindex_thresh = boosted ? 70 : (is_arf2_bwd_type ? 110 : 140);
    if (!is_720p_or_larger && cm->quant_params.base_qindex <= qindex_thresh) {
      sf->part_sf.simple_motion_search_split =
          cm->features.allow_screen_content_tools ? 1 : 2;
      sf->part_sf.simple_motion_search_early_term_none = 1;
      sf->tx_sf.model_based_prune_tx_search_level = 0;
    }

    if (is_720p_or_larger && cm->quant_params.base_qindex <= 128) {
      sf->rd_sf.perform_coeff_opt = 2 + is_1080p_or_larger;
      memcpy(winner_mode_params->coeff_opt_thresholds,
             &coeff_opt_thresholds[sf->rd_sf.perform_coeff_opt],
             sizeof(winner_mode_params->coeff_opt_thresholds));
      sf->part_sf.simple_motion_search_split =
          cm->features.allow_screen_content_tools ? 1 : 2;
      sf->tx_sf.inter_tx_size_search_init_depth_rect = 1;
      sf->tx_sf.inter_tx_size_search_init_depth_sqr = 1;
      sf->tx_sf.intra_tx_size_search_init_depth_rect = 1;
      sf->tx_sf.model_based_prune_tx_search_level = 0;

      if (is_1080p_or_larger && cm->quant_params.base_qindex <= 108) {
        sf->inter_sf.selective_ref_frame = 2;
        sf->rd_sf.tx_domain_dist_level = boosted ? 1 : 2;
        sf->rd_sf.tx_domain_dist_thres_level = 1;
        sf->part_sf.simple_motion_search_early_term_none = 1;
        sf->tx_sf.tx_type_search.ml_tx_split_thresh = 4000;
        sf->interp_sf.cb_pred_filter_search = 0;
        sf->tx_sf.tx_type_search.prune_2d_txfm_mode = TX_TYPE_PRUNE_2;
        sf->tx_sf.tx_type_search.skip_tx_search = 1;
      }
    }
  }

  if (speed >= 2) {
    // Disable extended partitions for lower quantizers
    const int aggr = AOMMIN(4, speed - 2);
    const int qindex_thresh1[4] = { 50, 50, 80, 100 };
    const int qindex_thresh2[4] = { 80, 100, 120, 160 };
    int qindex_thresh;
    if (aggr <= 1) {
      const int qthresh2 =
          (!aggr && !is_480p_or_larger) ? 70 : qindex_thresh2[aggr];
      qindex_thresh = cm->features.allow_screen_content_tools
                          ? qindex_thresh1[aggr]
                          : qthresh2;
      if (cm->quant_params.base_qindex <= qindex_thresh && !boosted)
        sf->part_sf.ext_partition_eval_thresh = BLOCK_128X128;
    } else if (aggr <= 2) {
      qindex_thresh = boosted ? qindex_thresh1[aggr] : qindex_thresh2[aggr];
      if (cm->quant_params.base_qindex <= qindex_thresh &&
          !frame_is_intra_only(cm))
        sf->part_sf.ext_partition_eval_thresh = BLOCK_128X128;
    } else if (aggr <= 3) {
      if (!is_480p_or_larger) {
        sf->part_sf.ext_partition_eval_thresh = BLOCK_128X128;
      } else if (!is_720p_or_larger && !frame_is_intra_only(cm) &&
                 !cm->features.allow_screen_content_tools) {
        sf->part_sf.ext_partition_eval_thresh = BLOCK_128X128;
      } else {
        qindex_thresh = boosted ? qindex_thresh1[aggr] : qindex_thresh2[aggr];
        if (cm->quant_params.base_qindex <= qindex_thresh &&
            !frame_is_intra_only(cm))
          sf->part_sf.ext_partition_eval_thresh = BLOCK_128X128;
      }
    } else {
      sf->part_sf.ext_partition_eval_thresh = BLOCK_128X128;
    }
  }

  if (speed >= 4) {
    // Disable rectangular partitions for lower quantizers
    const int aggr = AOMMIN(1, speed - 4);
    const int qindex_thresh[2] = { 65, 80 };
    int disable_rect_part;
    disable_rect_part = !boosted;
    if (cm->quant_params.base_qindex <= qindex_thresh[aggr] &&
        disable_rect_part && is_480p_or_larger) {
      sf->part_sf.rect_partition_eval_thresh = BLOCK_8X8;
    }
  }

  if (speed <= 2) {
    if (!is_stat_generation_stage(cpi)) {
      // Use faster full-pel motion search for high quantizers.
      // Also use reduced total search range for low resolutions at high
      // quantizers.
      const int aggr = speed;
      const int qindex_thresh1 = ms_qindex_thresh[aggr][is_720p_or_larger][0];
      const int qindex_thresh2 = ms_qindex_thresh[aggr][is_720p_or_larger][1];
      const SEARCH_METHODS search_method =
          motion_search_method[is_720p_or_larger];
      if (cm->quant_params.base_qindex > qindex_thresh1) {
        sf->mv_sf.search_method = search_method;
        sf->tpl_sf.search_method = search_method;
      } else if (cm->quant_params.base_qindex > qindex_thresh2) {
        sf->mv_sf.search_method = NSTEP_8PT;
      }
    }
  }

  if (speed >= 4) {
    // Disable LR search at low and high quantizers and enable only for
    // mid-quantizer range.
    if (!boosted && !is_arf2_bwd_type) {
      const int qindex_low[2] = { 100, 60 };
      const int qindex_high[2] = { 180, 160 };
      if (cm->quant_params.base_qindex <= qindex_low[is_720p_or_larger] ||
          cm->quant_params.base_qindex > qindex_high[is_720p_or_larger]) {
        sf->lpf_sf.disable_loop_restoration_luma = 1;
      }
    }
  }

  if (speed == 1) {
    // Reuse interinter wedge mask search from first search for non-boosted
    // non-internal-arf frames, except at very high quantizers.
    if (cm->quant_params.base_qindex <= 200) {
      if (!boosted && !is_arf2_bwd_type)
        sf->inter_sf.reuse_mask_search_results = 1;
    }
  }

  if (speed == 5) {
    if (!(frame_is_intra_only(&cpi->common) ||
          cm->features.allow_screen_content_tools)) {
      const int qindex[2] = { 256, 128 };
      // Set the sf value as 3 for low resolution and
      // for higher resolutions with low quantizers.
      if (cm->quant_params.base_qindex < qindex[is_480p_or_larger])
        sf->tx_sf.tx_type_search.winner_mode_tx_type_pruning = 3;
    }
  }

  if (speed >= 5) {
    // Disable the sf for low quantizers in case of low resolution screen
    // contents.
    if (cm->features.allow_screen_content_tools &&
        cm->quant_params.base_qindex < 128 && is_480p_or_lesser) {
      sf->part_sf.prune_sub_8x8_partition_level = 0;
    }
  }

  // Loop restoration size search
  // At speed 0, always search all available sizes for the maximum possible gain
  sf->lpf_sf.min_lr_unit_size = RESTORATION_PROC_UNIT_SIZE;
  sf->lpf_sf.max_lr_unit_size = RESTORATION_UNITSIZE_MAX;

  if (speed >= 1) {
    // For large frames, small restoration units are almost never useful,
    // so prune them away
    if (is_1440p_or_larger) {
      sf->lpf_sf.min_lr_unit_size = RESTORATION_UNITSIZE_MAX;
    } else if (is_720p_or_larger) {
      sf->lpf_sf.min_lr_unit_size = RESTORATION_UNITSIZE_MAX >> 1;
    }
  }

  if (speed >= 3 || (cpi->oxcf.mode == ALLINTRA && speed >= 1)) {
    // At this speed, a full search is too expensive. Instead, pick a single
    // size based on size and qindex. Note that, in general, higher quantizers
    // (== lower quality) and larger frames generally want to use larger
    // restoration units.
    int qindex_thresh = 96;
    if (cm->quant_params.base_qindex <= qindex_thresh && !is_1440p_or_larger) {
      sf->lpf_sf.min_lr_unit_size = RESTORATION_UNITSIZE_MAX >> 1;
      sf->lpf_sf.max_lr_unit_size = RESTORATION_UNITSIZE_MAX >> 1;
    } else {
      sf->lpf_sf.min_lr_unit_size = RESTORATION_UNITSIZE_MAX;
      sf->lpf_sf.max_lr_unit_size = RESTORATION_UNITSIZE_MAX;
    }
  }

  set_subpel_search_method(&cpi->mv_search_params,
                           cpi->oxcf.unit_test_cfg.motion_vector_unit_test,
                           sf->mv_sf.subpel_search_method);

  if (cpi->oxcf.enable_low_complexity_decode)
    set_speed_features_lc_dec_qindex_dependent(cpi, sf, speed);
}